

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O2

void highbd_copy_and_extend_plane
               (uint8_t *src8,int src_pitch,uint8_t *dst8,int dst_pitch,int w,int h,int extend_top,
               int extend_left,int extend_bottom,int extend_right)

{
  undefined2 uVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  undefined2 *__src;
  int iVar8;
  undefined2 *puVar9;
  void *pvVar10;
  void *pvVar11;
  long lVar12;
  bool bVar13;
  
  lVar4 = (long)dst8 * 2;
  sVar2 = (long)w * 2;
  puVar9 = (undefined2 *)(sVar2 + (long)src8 * 2 + -2);
  __src = (undefined2 *)((long)src8 * 2);
  lVar12 = (long)extend_left;
  pvVar10 = (void *)(lVar4 + lVar12 * -2);
  lVar6 = sVar2 + (long)dst8 * 2;
  iVar8 = 0;
  iVar7 = 0;
  if (0 < h) {
    iVar7 = h;
  }
  lVar3 = (long)dst_pitch * 2;
  pvVar11 = pvVar10;
  for (; iVar8 != iVar7; iVar8 = iVar8 + 1) {
    uVar1 = *__src;
    for (lVar5 = 0; lVar12 != lVar5; lVar5 = lVar5 + 1) {
      *(undefined2 *)((long)pvVar11 + lVar5 * 2) = uVar1;
    }
    memcpy((void *)((long)pvVar11 + lVar12 * 2),__src,sVar2);
    uVar1 = *puVar9;
    for (lVar5 = 0; extend_right != lVar5; lVar5 = lVar5 + 1) {
      *(undefined2 *)(lVar6 + lVar5 * 2) = uVar1;
    }
    __src = __src + src_pitch;
    puVar9 = puVar9 + src_pitch;
    pvVar11 = (void *)((long)pvVar11 + lVar3);
    lVar6 = lVar6 + lVar3;
  }
  pvVar11 = (void *)(lVar4 + (long)-(dst_pitch * extend_top) * 2 + lVar12 * -2);
  sVar2 = (long)(extend_left + w + extend_right) * 2;
  iVar7 = 0;
  if (0 < extend_top) {
    iVar7 = extend_top;
  }
  while (iVar7 != 0) {
    memcpy(pvVar11,pvVar10,sVar2);
    pvVar11 = (void *)((long)pvVar11 + lVar3);
    iVar7 = iVar7 + -1;
  }
  pvVar10 = (void *)(lVar4 + (long)(h * dst_pitch) * 2 + lVar12 * -2);
  iVar7 = 0;
  if (0 < extend_bottom) {
    iVar7 = extend_bottom;
  }
  while (bVar13 = iVar7 != 0, iVar7 = iVar7 + -1, bVar13) {
    memcpy(pvVar10,(void *)(lVar4 + (long)((h + -1) * dst_pitch) * 2 + lVar12 * -2),sVar2);
    pvVar10 = (void *)((long)pvVar10 + lVar3);
  }
  return;
}

Assistant:

static void highbd_copy_and_extend_plane(const uint8_t *src8, int src_pitch,
                                         uint8_t *dst8, int dst_pitch, int w,
                                         int h, int extend_top, int extend_left,
                                         int extend_bottom, int extend_right) {
  int i, linesize;
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);

  // copy the left and right most columns out
  const uint16_t *src_ptr1 = src;
  const uint16_t *src_ptr2 = src + w - 1;
  uint16_t *dst_ptr1 = dst - extend_left;
  uint16_t *dst_ptr2 = dst + w;

  for (i = 0; i < h; i++) {
    aom_memset16(dst_ptr1, src_ptr1[0], extend_left);
    memcpy(dst_ptr1 + extend_left, src_ptr1, w * sizeof(src_ptr1[0]));
    aom_memset16(dst_ptr2, src_ptr2[0], extend_right);
    src_ptr1 += src_pitch;
    src_ptr2 += src_pitch;
    dst_ptr1 += dst_pitch;
    dst_ptr2 += dst_pitch;
  }

  // Now copy the top and bottom lines into each line of the respective
  // borders
  src_ptr1 = dst - extend_left;
  src_ptr2 = dst + dst_pitch * (h - 1) - extend_left;
  dst_ptr1 = dst + dst_pitch * (-extend_top) - extend_left;
  dst_ptr2 = dst + dst_pitch * (h)-extend_left;
  linesize = extend_left + extend_right + w;
  assert(linesize <= dst_pitch);

  for (i = 0; i < extend_top; i++) {
    memcpy(dst_ptr1, src_ptr1, linesize * sizeof(src_ptr1[0]));
    dst_ptr1 += dst_pitch;
  }

  for (i = 0; i < extend_bottom; i++) {
    memcpy(dst_ptr2, src_ptr2, linesize * sizeof(src_ptr2[0]));
    dst_ptr2 += dst_pitch;
  }
}